

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
          *enum_generators,
          vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          *extension_generators)

{
  ExtensionGenerator *in_RAX;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar1;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar2;
  long lVar3;
  ExtensionGenerator *local_38;
  
  local_38 = in_RAX;
  if (0 < *(int *)(this->descriptor_ + 0x58)) {
    lVar3 = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar3);
      local_38 = (ExtensionGenerator *)psVar1->ptr_;
      std::
      vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
      ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
                ((vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
                  *)enum_generators,(EnumGenerator **)&local_38);
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(this->descriptor_ + 0x58));
  }
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    lVar3 = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar3);
      local_38 = psVar2->ptr_;
      std::
      vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
      ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
                ((vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
                  *)extension_generators,&local_38);
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(this->descriptor_ + 0x78));
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<EnumGenerator*>* enum_generators,
    std::vector<ExtensionGenerator*>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->push_back(enum_generators_[i].get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->push_back(extension_generators_[i].get());
  }
}